

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

int __thiscall Thread::join(Thread *this)

{
  uint __line;
  int iVar1;
  char *__assertion;
  
  if (this->started_ == false) {
    __assertion = "started_";
    __line = 0x60;
  }
  else {
    if (this->joined_ != true) {
      this->joined_ = true;
      iVar1 = pthread_join(this->pthreadId_,(void **)0x0);
      return iVar1;
    }
    __assertion = "!joined_";
    __line = 0x61;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/Thread.cpp"
                ,__line,"int Thread::join()");
}

Assistant:

int Thread::join(){
    assert(started_);
    assert(!joined_);
    joined_=true;
    return pthread_join(pthreadId_, nullptr);
}